

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async.c++
# Opt level: O2

void __thiscall kj::_::ForkBranchBase::~ForkBranchBase(ForkBranchBase *this)

{
  ForkBranchBase *pFVar1;
  ForkBranchBase ***pppFVar2;
  AsyncObject *this_00;
  
  (this->super_PromiseNode).super_PromiseArenaMember._vptr_PromiseArenaMember =
       (_func_int **)&PTR___cxa_pure_virtual_0036cf20;
  if (this->prevPtr != (ForkBranchBase **)0x0) {
    pFVar1 = this->next;
    *this->prevPtr = pFVar1;
    pppFVar2 = &pFVar1->prevPtr;
    if (pFVar1 == (ForkBranchBase *)0x0) {
      pppFVar2 = &((this->hub).ptr)->tailBranch;
    }
    *pppFVar2 = this->prevPtr;
  }
  this_00 = (AsyncObject *)&this->hub;
  Own<kj::_::ForkHubBase,_kj::_::ForkHubBase>::dispose
            ((Own<kj::_::ForkHubBase,_kj::_::ForkHubBase> *)this_00);
  AsyncObject::~AsyncObject(this_00);
  return;
}

Assistant:

ForkBranchBase::~ForkBranchBase() noexcept(false) {
  if (prevPtr != nullptr) {
    // Remove from hub's linked list of branches.
    *prevPtr = next;
    (next == nullptr ? hub->tailBranch : next->prevPtr) = prevPtr;
  }
}